

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O2

void __thiscall
duckdb_shell::ModeBoxRenderer::RenderHeader(ModeBoxRenderer *this,ColumnarResult *result)

{
  char *str;
  idx_t i;
  ulong i_00;
  
  print_box_row_separator
            (this,(int)result->column_count,anon_var_dwarf_1ae02,anon_var_dwarf_1ae0c,
             anon_var_dwarf_1ae16,&result->column_width);
  ShellState::Print((this->super_ColumnRenderer).super_ShellRenderer.state,anon_var_dwarf_1ae4c + 1)
  ;
  for (i_00 = 0; i_00 < result->column_count; i_00 = i_00 + 1) {
    ColumnRenderer::RenderAlignedValue(&this->super_ColumnRenderer,result,i_00);
    str = anon_var_dwarf_1ae4c;
    if (i_00 == result->column_count - 1) {
      str = anon_var_dwarf_1ae36;
    }
    ShellState::Print((this->super_ColumnRenderer).super_ShellRenderer.state,str);
  }
  print_box_row_separator
            (this,(int)result->column_count,anon_var_dwarf_1ae56,anon_var_dwarf_1ae60,
             anon_var_dwarf_1ae6a,&result->column_width);
  return;
}

Assistant:

void RenderHeader(ColumnarResult &result) override {
		print_box_row_separator(result.column_count, BOX_23, BOX_234, BOX_34, result.column_width);
		state.Print(BOX_13 " ");
		for (idx_t i = 0; i < result.column_count; i++) {
			RenderAlignedValue(result, i);
			state.Print(i == result.column_count - 1 ? " " BOX_13 "\n" : " " BOX_13 " ");
		}
		print_box_row_separator(result.column_count, BOX_123, BOX_1234, BOX_134, result.column_width);
	}